

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O0

void __thiscall
COLLADASaxFWL::KinematicLink::addAttachment(KinematicLink *this,KinematicAttachment *attachement)

{
  value_type *in_RDI;
  vector<COLLADASaxFWL::KinematicAttachment_*,_std::allocator<COLLADASaxFWL::KinematicAttachment_*>_>
  *unaff_retaddr;
  
  std::
  vector<COLLADASaxFWL::KinematicAttachment_*,_std::allocator<COLLADASaxFWL::KinematicAttachment_*>_>
  ::push_back(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void addAttachment( KinematicAttachment* attachement ) { mAttachments.push_back(attachement); }